

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

dma_memory memory_allocate_dma(size_t size,_Bool require_contiguous)

{
  long lVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *vaddr;
  uintptr_t uVar6;
  ulong uVar7;
  __off_t _Var8;
  ssize_t sVar9;
  undefined8 extraout_RAX;
  uintptr_t *puVar10;
  undefined8 extraout_RAX_00;
  uintptr_t extraout_RDX;
  uintptr_t extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong *__buf;
  long *plVar11;
  long *plVar12;
  void *pvVar13;
  void *pvVar14;
  char *unaff_R14;
  uintptr_t *virt;
  ulong uVar15;
  dma_memory dVar16;
  dma_memory dVar17;
  dma_memory dVar18;
  dma_memory dVar19;
  char buf [512];
  char path [4096];
  undefined8 uVar20;
  long *plVar21;
  ulong auStack_1448 [66];
  ulong uStack_1238;
  char *pcStack_1230;
  long alStack_1218 [64];
  char local_1018 [4096];
  
  plVar11 = alStack_1218;
  if (VFIO_CONTAINER_FILE_DESCRIPTOR == -1) {
    fprintf(_stderr,"[DEBUG] %s:%d %s(): allocating dma memory via huge page\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x39,
            "memory_allocate_dma");
    uVar2 = huge_pg_id;
    size = size + 0x1fffff & 0xffffffffffe00000;
    if (require_contiguous && 0x200000 < size) {
      memory_allocate_dma_cold_6();
      goto LAB_00104d7f;
    }
    LOCK();
    huge_pg_id = huge_pg_id + 1;
    UNLOCK();
    uVar3 = getpid();
    unaff_R14 = local_1018;
    snprintf(unaff_R14,0x1000,"/mnt/huge/ixy-%d-%d",(ulong)uVar3,(ulong)uVar2);
    iVar4 = open(unaff_R14,0x42,0x1c0);
    if (iVar4 == -1) goto LAB_00104d8c;
    iVar5 = ftruncate(iVar4,size);
    if (iVar5 == -1) goto LAB_00104d94;
    vaddr = (char *)mmap((void *)0x0,size,3,0x40001,iVar4,0);
    if (vaddr == (char *)0xffffffffffffffff) goto LAB_00104d9c;
    iVar5 = mlock(vaddr,size);
    if (iVar5 != -1) {
      close(iVar4);
      unlink(local_1018);
      uVar6 = virt_to_phys(vaddr);
      goto LAB_00104d68;
    }
  }
  else {
    fprintf(_stderr,"[DEBUG] %s:%d %s(): allocating dma memory via VFIO\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x2f,
            "memory_allocate_dma");
    vaddr = (char *)mmap((void *)0x0,size,3,0x54040021,-1,0);
    if (vaddr != (char *)0xffffffffffffffff) {
      uVar6 = vfio_map_dma(vaddr,(uint32_t)size);
LAB_00104d68:
      dVar17.phy = uVar6;
      dVar17.virt = vaddr;
      return dVar17;
    }
LAB_00104d7f:
    memory_allocate_dma_cold_1();
LAB_00104d8c:
    memory_allocate_dma_cold_5();
LAB_00104d94:
    memory_allocate_dma_cold_4();
LAB_00104d9c:
    vaddr = unaff_R14;
    memory_allocate_dma_cold_3();
  }
  memory_allocate_dma_cold_2();
  uStack_1238 = size;
  pcStack_1230 = vaddr;
  uVar7 = sysconf(0x1e);
  __buf = (ulong *)0x0;
  iVar4 = open("/proc/self/pagemap",0);
  if (iVar4 == -1) {
    virt_to_phys_cold_4();
LAB_00104e5a:
    virt_to_phys_cold_3();
  }
  else {
    __buf = (ulong *)(((ulong)plVar11 / uVar7) * 8);
    _Var8 = lseek(iVar4,(__off_t)__buf,0);
    if (_Var8 == -1) goto LAB_00104e5a;
    __buf = auStack_1448;
    auStack_1448[0] = 0;
    sVar9 = read(iVar4,__buf,8);
    if (sVar9 != -1) {
      close(iVar4);
      if (auStack_1448[0] != 0) {
        dVar16.phy = extraout_RDX;
        dVar16.virt = (void *)((ulong)plVar11 % uVar7 + (auStack_1448[0] & 0x7fffffffffffff) * uVar7
                              );
        return dVar16;
      }
      goto LAB_00104e6e;
    }
  }
  virt_to_phys_cold_2();
LAB_00104e6e:
  plVar12 = plVar11;
  virt_to_phys_cold_1();
  uVar15 = 0x800;
  if ((int)__buf != 0) {
    uVar15 = (ulong)__buf & 0xffffffff;
  }
  if ((VFIO_CONTAINER_FILE_DESCRIPTOR == -1) && ((int)(0x200000 % uVar15) != 0)) {
    uVar20 = extraout_RAX;
    plVar21 = plVar11;
    memory_allocate_mempool_cold_1();
    uVar3 = *(uint *)(plVar12 + 2);
    pvVar13 = (void *)(extraout_RDX_01 & 0xffffffff);
    uVar15 = extraout_RDX_01;
    pvVar14 = (void *)(ulong)uVar3;
    if (uVar3 < (uint)extraout_RDX_01) {
      fprintf(_stderr,"[WARN ] %s:%d %s(): memory pool %p only has %d free bufs, requested %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x7d,
              "pkt_buf_alloc_batch",plVar12,(void *)(ulong)uVar3,pvVar13,extraout_RAX_00,plVar11,
              uVar7,uVar20,plVar21);
      pvVar13 = (void *)(ulong)*(uint *)(plVar12 + 2);
      uVar15 = extraout_RDX_02;
      pvVar14 = pvVar13;
    }
    if ((int)pvVar13 != 0) {
      lVar1 = plVar12[1];
      uVar15 = 0;
      do {
        uVar3 = (int)pvVar14 - 1;
        pvVar14 = (void *)(ulong)uVar3;
        *(ulong *)((long)__buf + uVar15) =
             (ulong)(uint)(*(int *)((long)plVar12 + (long)pvVar14 * 4 + 0x14) * (int)lVar1) +
             *plVar12;
        uVar15 = uVar15 + 8;
      } while ((long)pvVar13 << 3 != uVar15);
      *(uint *)(plVar12 + 2) = uVar3;
    }
    dVar19.phy = uVar15;
    dVar19.virt = pvVar13;
    return dVar19;
  }
  iVar4 = (int)plVar12;
  dVar18.virt = (long *)malloc(((ulong)plVar12 & 0xffffffff) * 4 + 0x18);
  iVar5 = (int)uVar15;
  uVar3 = 0;
  dVar17 = memory_allocate_dma((ulong)(uint)(iVar5 * iVar4),false);
  uVar6 = dVar17.phy;
  *(int *)((long)dVar18.virt + 0xc) = iVar4;
  *(int *)(dVar18.virt + 1) = iVar5;
  *dVar18.virt = (long)dVar17.virt;
  *(int *)(dVar18.virt + 2) = iVar4;
  if (iVar4 != 0) {
    uVar7 = 0;
    do {
      *(int *)((long)dVar18.virt + uVar7 * 4 + 0x14) = (int)uVar7;
      virt = (uintptr_t *)((ulong)uVar3 + *dVar18.virt);
      puVar10 = virt;
      if (VFIO_CONTAINER_FILE_DESCRIPTOR == -1) {
        puVar10 = (uintptr_t *)virt_to_phys(virt);
        uVar6 = extraout_RDX_00;
      }
      *virt = (uintptr_t)puVar10;
      *(int *)(virt + 2) = (int)uVar7;
      uVar7 = uVar7 + 1;
      uVar3 = uVar3 + iVar5;
      virt[1] = (uintptr_t)dVar18.virt;
      *(undefined4 *)((long)virt + 0x14) = 0;
    } while (((ulong)plVar12 & 0xffffffff) != uVar7);
  }
  dVar18.phy = uVar6;
  return dVar18;
}

Assistant:

struct dma_memory memory_allocate_dma(size_t size, bool require_contiguous) {
	if (VFIO_CONTAINER_FILE_DESCRIPTOR != -1) {
		// VFIO == -1 means that there is no VFIO container set, i.e. VFIO / IOMMU is not activated
		debug("allocating dma memory via VFIO");
		void* virt_addr = (void*) check_err(mmap(NULL, size, PROT_READ | PROT_WRITE, MAP_SHARED | MAP_ANONYMOUS | MAP_HUGETLB | MAP_HUGE_2MB, -1, 0), "mmap hugepage");
		// create IOMMU mapping
		uint64_t iova = (uint64_t) vfio_map_dma(virt_addr, size);
		return (struct dma_memory){
			// for VFIO, this needs to point to the device view memory = IOVA!
			.virt = virt_addr,
			.phy = iova
		};
	} else {
		debug("allocating dma memory via huge page");
		// round up to multiples of 2 MB if necessary, this is the wasteful part
		// this could be fixed by co-locating allocations on the same page until a request would be too large
		// when fixing this: make sure to align on 128 byte boundaries (82599 dma requirement)
		if (size % HUGE_PAGE_SIZE) {
			size = ((size >> HUGE_PAGE_BITS) + 1) << HUGE_PAGE_BITS;
		}
		if (require_contiguous && size > HUGE_PAGE_SIZE) {
			// this is the place to implement larger contiguous physical mappings if that's ever needed
			error("could not map physically contiguous memory");
		}
		// unique filename, C11 stdatomic.h requires a too recent gcc, we want to support gcc 4.8
		uint32_t id = __sync_fetch_and_add(&huge_pg_id, 1);
		char path[PATH_MAX];
		snprintf(path, PATH_MAX, "/mnt/huge/ixy-%d-%d", getpid(), id);
		// temporary file, will be deleted to prevent leaks of persistent pages
		int fd = check_err(open(path, O_CREAT | O_RDWR, S_IRWXU), "open hugetlbfs file, check that /mnt/huge is mounted");
		check_err(ftruncate(fd, (off_t) size), "allocate huge page memory, check hugetlbfs configuration");
		void* virt_addr = (void*) check_err(mmap(NULL, size, PROT_READ | PROT_WRITE, MAP_SHARED | MAP_HUGETLB, fd, 0), "mmap hugepage");
		// never swap out DMA memory
		check_err(mlock(virt_addr, size), "disable swap for DMA memory");
		// don't keep it around in the hugetlbfs
		close(fd);
		unlink(path);
		return (struct dma_memory) {
			.virt = virt_addr,
			.phy = virt_to_phys(virt_addr)
		};
	}
}